

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_node *
pugi::impl::(anonymous_namespace)::
median3<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
          (xpath_node *first,xpath_node *middle,xpath_node *last,document_order_comparator *pred)

{
  bool bVar1;
  document_order_comparator *pred_local;
  xpath_node *last_local;
  xpath_node *middle_local;
  xpath_node *first_local;
  
  pred_local = (document_order_comparator *)last;
  last_local = middle;
  middle_local = first;
  bVar1 = anon_unknown_0::document_order_comparator::operator()(pred,middle,first);
  if (bVar1) {
    swap<pugi::xpath_node*>(&last_local,&middle_local);
  }
  bVar1 = anon_unknown_0::document_order_comparator::operator()
                    (pred,(xpath_node *)pred_local,last_local);
  if (bVar1) {
    swap<pugi::xpath_node*>((xpath_node **)&pred_local,&last_local);
  }
  bVar1 = anon_unknown_0::document_order_comparator::operator()(pred,last_local,middle_local);
  if (bVar1) {
    swap<pugi::xpath_node*>(&last_local,&middle_local);
  }
  return last_local;
}

Assistant:

inline I median3(I first, I middle, I last, const Pred& pred)
	{
		if (pred(*middle, *first))
			swap(middle, first);
		if (pred(*last, *middle))
			swap(last, middle);
		if (pred(*middle, *first))
			swap(middle, first);

		return middle;
	}